

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O1

void __thiscall Tree::BuildVirtualFolder(Tree *this,string *virtualFolders)

{
  char *__end;
  pointer this_00;
  string local_50;
  
  std::__cxx11::string::append((char *)virtualFolders);
  this_00 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (this_00 !=
      (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"","");
      BuildVirtualFolderImpl(this_00,virtualFolders,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::append((char *)virtualFolders);
  return;
}

Assistant:

void Tree::BuildVirtualFolder(std::string& virtualFolders) const
{
  virtualFolders += "<Option virtualFolders=\"CMake Files\\;";
  for (std::vector<Tree>::const_iterator it = folders.begin();
     it != folders.end();
     ++it)
    {
    it->BuildVirtualFolderImpl(virtualFolders, "");
    }
  virtualFolders += "\" />";
}